

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O1

Value * __thiscall Kvm::makeIf(Kvm *this,Value *pred,Value *conseq,Value *alternate)

{
  Kgc *this_00;
  pointer *ppppVVar1;
  Value *pVVar2;
  Value *pVVar3;
  Value *pVVar4;
  Value *result;
  Value *local_50;
  undefined8 local_48;
  Value *local_40;
  Value *local_38;
  
  local_50 = (Value *)0x0;
  this_00 = &this->gc_;
  local_48 = 0;
  local_40 = pred;
  local_38 = conseq;
  Kgc::pushLocalStackRoot(this_00,&local_50);
  pVVar3 = this->NIL;
  local_48 = 0xfffffffffffffff8;
  pVVar2 = Kgc::allocValue(this_00,CELL);
  pVVar2[1]._vptr_Value = (_func_int **)alternate;
  *(Value **)&pVVar2[1].type_ = pVVar3;
  local_50 = pVVar2;
  pVVar3 = Kgc::allocValue(this_00,CELL);
  pVVar3[1]._vptr_Value = (_func_int **)local_38;
  *(Value **)&pVVar3[1].type_ = pVVar2;
  local_50 = pVVar3;
  pVVar2 = Kgc::allocValue(this_00,CELL);
  pVVar2[1]._vptr_Value = (_func_int **)local_40;
  *(Value **)&pVVar2[1].type_ = pVVar3;
  pVVar3 = this->IF;
  local_50 = pVVar2;
  pVVar4 = Kgc::allocValue(this_00,CELL);
  pVVar4[1]._vptr_Value = (_func_int **)pVVar3;
  *(Value **)&pVVar4[1].type_ = pVVar2;
  ppppVVar1 = &(this->gc_).localStackRoots_.
               super__Vector_base<const_Value_**,_std::allocator<const_Value_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
  *ppppVVar1 = *ppppVVar1 + -1;
  return pVVar4;
}

Assistant:

const Value* Kvm::makeIf(const Value *pred, const Value *conseq, const Value *alternate)
{
    const Value *result = nullptr;
    GcGuard guard{gc_};
    guard.pushLocalStackRoot(&result);
    result = makeCell(alternate, NIL);
    result = makeCell(conseq, result);
    result = makeCell(pred, result);
    result = makeCell(IF, result);
    return result;
}